

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTexture1D::TestTexture1D(TestTexture1D *this,TextureFormat *format,int width)

{
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> local_48;
  int local_1c;
  TextureFormat *pTStack_18;
  int width_local;
  TextureFormat *format_local;
  TestTexture1D *this_local;
  
  local_1c = width;
  pTStack_18 = format;
  format_local = (TextureFormat *)this;
  TestTexture::TestTexture(&this->super_TestTexture,format,width,1,1);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTexture1D_016a4328;
  tcu::Texture1D::Texture1D(&this->m_texture,pTStack_18,local_1c);
  allocateLevels<tcu::Texture1D>(&this->m_texture);
  getLevelsVector<tcu::Texture1D>(&local_48,&this->m_texture);
  TestTexture::populateLevels(&this->super_TestTexture,&local_48);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~vector(&local_48);
  return;
}

Assistant:

TestTexture1D::TestTexture1D (const tcu::TextureFormat& format, int width)
	: TestTexture	(format, width, 1, 1)
	, m_texture		(format, width)
{
	allocateLevels(m_texture);
	TestTexture::populateLevels(getLevelsVector(m_texture));
}